

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool server::searchmodename(char *haystack,char *needle)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  char cVar5;
  
  cVar1 = *needle;
  if (cVar1 == '\0') {
LAB_0013559a:
    bVar3 = true;
  }
  else {
    do {
      if (cVar1 != '.') {
        pcVar2 = strchr(haystack,(int)cVar1);
        if (pcVar2 == (char *)0x0) break;
        haystack = pcVar2 + 1;
      }
      cVar5 = *haystack;
      pcVar4 = needle + 1;
      pcVar2 = haystack;
      if (cVar5 == '\0') {
        bVar3 = true;
      }
      else {
        do {
          if (*pcVar4 == '\0') goto LAB_0013559a;
          if (cVar5 == *pcVar4) {
            pcVar4 = pcVar4 + 1;
          }
          else if (cVar5 != ' ') {
            bVar3 = false;
            goto LAB_00135584;
          }
          cVar5 = pcVar2[1];
          pcVar2 = pcVar2 + 1;
        } while (cVar5 != '\0');
        bVar3 = true;
      }
LAB_00135584:
      if (*pcVar4 == '\0') goto LAB_0013559a;
      if (*pcVar4 == '.') {
        return bVar3;
      }
    } while (cVar1 != '.');
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool searchmodename(const char *haystack, const char *needle)
    {
        if(!needle[0]) return true;
        do
        {
            if(needle[0] != '.')
            {
                haystack = strchr(haystack, needle[0]);
                if(!haystack) break;
                haystack++;
            }
            const char *h = haystack, *n = needle+1;
            for(; *h && *n; h++)
            {
                if(*h == *n) n++;
                else if(*h != ' ') break;
            }
            if(!*n) return true;
            if(*n == '.') return !*h;
        } while(needle[0] != '.');
        return false;
    }